

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O1

void Ivy_ManCollectCone_rec(Ivy_Obj_t *pObj,Vec_Ptr_t *vCone)

{
  uint uVar1;
  uint uVar2;
  void **ppvVar3;
  long lVar4;
  int iVar5;
  
  if ((*(uint *)&pObj->field_0x8 & 0x10) != 0) {
    return;
  }
  uVar2 = *(uint *)&pObj->field_0x8 & 0xf;
  if (uVar2 == 7) {
    Ivy_ManCollectCone_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vCone);
    uVar1 = vCone->nCap;
    if (vCone->nSize != uVar1) goto LAB_007e18ad;
  }
  else {
    if (uVar2 - 7 < 0xfffffffe) {
      __assert_fail("Ivy_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDfs.c"
                    ,0xb2,"void Ivy_ManCollectCone_rec(Ivy_Obj_t *, Vec_Ptr_t *)");
    }
    Ivy_ManCollectCone_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vCone);
    Ivy_ManCollectCone_rec((Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vCone);
    uVar2 = vCone->nSize;
    if (0 < (long)(int)uVar2) {
      lVar4 = 0;
      do {
        if ((Ivy_Obj_t *)vCone->pArray[lVar4] == pObj) {
          return;
        }
        lVar4 = lVar4 + 1;
      } while ((int)uVar2 != lVar4);
    }
    uVar1 = vCone->nCap;
    if (uVar2 != uVar1) goto LAB_007e18ad;
  }
  if ((int)uVar1 < 0x10) {
    if (vCone->pArray == (void **)0x0) {
      ppvVar3 = (void **)malloc(0x80);
    }
    else {
      ppvVar3 = (void **)realloc(vCone->pArray,0x80);
    }
    vCone->pArray = ppvVar3;
    iVar5 = 0x10;
  }
  else {
    iVar5 = uVar1 * 2;
    if (iVar5 <= (int)uVar1) goto LAB_007e18ad;
    if (vCone->pArray == (void **)0x0) {
      ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
    }
    else {
      ppvVar3 = (void **)realloc(vCone->pArray,(ulong)uVar1 << 4);
    }
    vCone->pArray = ppvVar3;
  }
  vCone->nCap = iVar5;
LAB_007e18ad:
  iVar5 = vCone->nSize;
  vCone->nSize = iVar5 + 1;
  vCone->pArray[iVar5] = pObj;
  return;
}

Assistant:

void Ivy_ManCollectCone_rec( Ivy_Obj_t * pObj, Vec_Ptr_t * vCone )
{
    if ( pObj->fMarkA )
        return;
    if ( Ivy_ObjIsBuf(pObj) )
    {
        Ivy_ManCollectCone_rec( Ivy_ObjFanin0(pObj), vCone );
        Vec_PtrPush( vCone, pObj );
        return;
    }
    assert( Ivy_ObjIsNode(pObj) );
    Ivy_ManCollectCone_rec( Ivy_ObjFanin0(pObj), vCone );
    Ivy_ManCollectCone_rec( Ivy_ObjFanin1(pObj), vCone );
    Vec_PtrPushUnique( vCone, pObj );
}